

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O2

string * __thiscall
cmFindPathCommand::FindHeaderInFramework
          (string *__return_storage_ptr__,cmFindPathCommand *this,string *file,string *dir,
          cmFindBaseDebugState *debug)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool *pbVar5;
  Glob *pGVar6;
  allocator<char> local_169;
  cmFindPathCommand *local_168;
  string glob;
  string frameWorkName;
  string fileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  Glob globIt;
  string local_90;
  string local_70;
  string local_50;
  
  local_168 = this;
  std::__cxx11::string::string((string *)&fileName,(string *)file);
  frameWorkName._M_dataplus._M_p = (pointer)&frameWorkName.field_2;
  frameWorkName._M_string_length = 0;
  frameWorkName.field_2._M_local_buf[0] = '\0';
  lVar3 = std::__cxx11::string::find((char)&fileName,0x2f);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)&globIt,(ulong)&fileName);
    std::__cxx11::string::operator=((string *)&fileName,(string *)&globIt);
    std::__cxx11::string::~string((string *)&globIt);
    std::__cxx11::string::_M_assign((string *)&frameWorkName);
    std::__cxx11::string::substr((ulong)&globIt,(ulong)&frameWorkName);
    std::__cxx11::string::operator=((string *)&frameWorkName,(string *)&globIt);
    std::__cxx11::string::~string((string *)&globIt);
    lVar3 = std::__cxx11::string::find((char)&frameWorkName,0x2f);
    if (lVar3 != -1) {
      std::__cxx11::string::_M_assign((string *)&fileName);
      frameWorkName._M_string_length = 0;
      *frameWorkName._M_dataplus._M_p = '\0';
    }
    if (frameWorkName._M_string_length != 0) {
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string&,char_const(&)[11]>
                ((string *)&globIt,dir,&frameWorkName,(char (*) [11])".framework");
      cmStrCat<std::__cxx11::string&,char_const(&)[10],std::__cxx11::string&>
                (&glob,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globIt,
                 (char (*) [10])0x6e7e2c,&fileName);
      bVar2 = cmsys::SystemTools::FileExists(&glob);
      if (bVar2) {
        pGVar6 = &globIt;
        if (local_168->IncludeFileInPath != false) {
          pGVar6 = (Glob *)&glob;
        }
        bVar2 = cmFindBase::Validate(&local_168->super_cmFindBase,(string *)pGVar6);
        if (bVar2) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          local_50._M_string_length = 0;
          local_50.field_2._M_local_buf[0] = '\0';
          cmFindBaseDebugState::FoundAt(debug,&glob,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          bVar2 = local_168->IncludeFileInPath;
          paVar1 = &__return_storage_ptr__->field_2;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
          if (bVar2 == true) {
            paVar4 = &glob.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)glob._M_dataplus._M_p == paVar4) {
              paVar1->_M_allocated_capacity = glob.field_2._M_allocated_capacity;
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = glob.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = glob._M_dataplus._M_p;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   glob.field_2._M_allocated_capacity;
            }
            pGVar6 = (Glob *)&glob;
          }
          else {
            paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&globIt.Relative;
            if (globIt.Internals == (GlobInternals *)paVar4) {
              paVar1->_M_allocated_capacity = (size_type)globIt.Relative._M_dataplus._M_p;
              *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) =
                   globIt.Relative._M_string_length;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)globIt.Internals;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   (size_type)globIt.Relative._M_dataplus._M_p;
            }
            pGVar6 = &globIt;
          }
          pbVar5 = &pGVar6->Recurse;
          __return_storage_ptr__->_M_string_length = *(size_type *)pbVar5;
          ((_Alloc_hider *)&((Glob *)(pbVar5 + -8))->Internals)->_M_p = (pointer)paVar4;
          *(size_type *)pbVar5 = 0;
          paVar4->_M_local_buf[0] = '\0';
          std::__cxx11::string::~string((string *)&glob);
          pGVar6 = &globIt;
          goto LAB_002febbc;
        }
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      cmFindBaseDebugState::FailedAt(debug,&glob,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&glob);
      std::__cxx11::string::~string((string *)&globIt);
    }
  }
  cmStrCat<std::__cxx11::string_const&,char_const(&)[21],std::__cxx11::string_const&>
            (&glob,dir,(char (*) [21])"*.framework/Headers/",file);
  cmsys::Glob::Glob(&globIt);
  cmsys::Glob::FindFiles(&globIt,&glob,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_(&globIt);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&files,__x);
  if (files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_169);
  }
  else {
    cmsys::SystemTools::CollapseFullPath
              (__return_storage_ptr__,
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    cmFindBaseDebugState::FoundAt(debug,__return_storage_ptr__,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (local_168->IncludeFileInPath == false) {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  cmsys::Glob::~Glob(&globIt);
  pGVar6 = (Glob *)&glob;
LAB_002febbc:
  std::__cxx11::string::~string((string *)pGVar6);
  std::__cxx11::string::~string((string *)&frameWorkName);
  std::__cxx11::string::~string((string *)&fileName);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindHeaderInFramework(
  std::string const& file, std::string const& dir,
  cmFindBaseDebugState& debug) const
{
  std::string fileName = file;
  std::string frameWorkName;
  std::string::size_type pos = fileName.find('/');
  // if there is a / in the name try to find the header as a framework
  // For example bar/foo.h would look for:
  // bar.framework/Headers/foo.h
  if (pos != std::string::npos) {
    // remove the name from the slash;
    fileName = fileName.substr(pos + 1);
    frameWorkName = file;
    frameWorkName =
      frameWorkName.substr(0, frameWorkName.size() - fileName.size() - 1);
    // if the framework has a path in it then just use the filename
    if (frameWorkName.find('/') != std::string::npos) {
      fileName = file;
      frameWorkName.clear();
    }
    if (!frameWorkName.empty()) {
      std::string fpath = cmStrCat(dir, frameWorkName, ".framework");
      std::string intPath = cmStrCat(fpath, "/Headers/", fileName);
      if (cmSystemTools::FileExists(intPath) &&
          this->Validate(this->IncludeFileInPath ? intPath : fpath)) {
        debug.FoundAt(intPath);
        if (this->IncludeFileInPath) {
          return intPath;
        }
        return fpath;
      }
      debug.FailedAt(intPath);
    }
  }
  // if it is not found yet or not a framework header, then do a glob search
  // for all frameworks in the directory: dir/*.framework/Headers/<file>
  std::string glob = cmStrCat(dir, "*.framework/Headers/", file);
  cmsys::Glob globIt;
  globIt.FindFiles(glob);
  std::vector<std::string> files = globIt.GetFiles();
  if (!files.empty()) {
    std::string fheader = cmSystemTools::CollapseFullPath(files[0]);
    debug.FoundAt(fheader);
    if (this->IncludeFileInPath) {
      return fheader;
    }
    fheader.resize(fheader.size() - file.size());
    return fheader;
  }

  // No frameworks matched the glob, so nothing more to add to debug.FailedAt()
  return "";
}